

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_check_id(lys_node *node,lys_node *parent,lys_module *module)

{
  uint uVar1;
  LYS_NODE LVar2;
  lys_node *plVar3;
  LYS_NODE LVar4;
  lys_node **pplVar5;
  lys_node *plVar6;
  lys_node_grp *plVar7;
  lys_node *plVar8;
  lys_node *plVar9;
  char *pcVar10;
  lys_node *plVar11;
  lys_node *node_00;
  char *name;
  lys_node *plVar12;
  bool bVar13;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x211,
                  "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x214,
                    "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
    }
LAB_0014ea9e:
    if ((module->field_0x40 & 1) != 0) {
      module = (lys_module *)module->data;
    }
  }
  else {
    module = parent->module;
    if (module != (lys_module *)0x0) goto LAB_0014ea9e;
    module = (lys_module *)0x0;
  }
  LVar4 = node->nodetype;
  uVar1 = LVar4 - LYS_CONTAINER;
  if (uVar1 < 0x40) {
    if ((0x808bUL >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_0014eac4;
    if ((ulong)uVar1 == 0x3f) {
      if (parent == (lys_node *)0x0) {
        pplVar5 = &module->data;
      }
      else {
        pplVar5 = lys_child(parent,LYS_CASE);
      }
      while( true ) {
        plVar12 = *pplVar5;
        if (plVar12 == (lys_node *)0x0) {
          return 0;
        }
        if ((((plVar12->nodetype & 0x807d) != LYS_UNKNOWN) && (plVar12->module == node->module)) &&
           (name = node->name, plVar12->name == name)) break;
        pplVar5 = &plVar12->next;
      }
      pcVar10 = "case";
      goto LAB_0014ed44;
    }
  }
  if (LVar4 == LYS_ANYDATA) {
LAB_0014eac4:
    if (parent == (lys_node *)0x0) {
LAB_0014eafd:
      pplVar5 = &module->data;
      plVar12 = (lys_node *)0x0;
    }
    else {
      do {
        while( true ) {
          plVar12 = parent;
          if (plVar12 == (lys_node *)0x0) goto LAB_0014eafd;
          LVar2 = plVar12->nodetype;
          if ((LVar2 & (LYS_AUGMENT|LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
            if (LVar2 == LYS_EXT) {
              pplVar5 = lys_child(plVar12,LVar4);
              goto LAB_0014eb8f;
            }
            goto LAB_0014eb8b;
          }
          if (LVar2 == LYS_AUGMENT) break;
          parent = plVar12->parent;
        }
        parent = plVar12->prev;
      } while (plVar12->prev != (lys_node *)0x0);
LAB_0014eb8b:
      pplVar5 = &plVar12->child;
    }
LAB_0014eb8f:
    do {
      plVar6 = *pplVar5;
      if (plVar6 == (lys_node *)0x0) {
        return 0;
      }
      LVar4 = plVar6->nodetype;
      if ((LVar4 & (LYS_USES|LYS_CASE)) != LYS_UNKNOWN) {
LAB_0014ebc7:
        pplVar5 = &plVar6->child;
        goto LAB_0014eb8f;
      }
      if ((((LVar4 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
            LYS_UNKNOWN) && (plVar6->module == node->module)) && (plVar6->name == node->name)) {
        pcVar10 = strnodetype(node->nodetype);
        name = node->name;
        goto LAB_0014ed44;
      }
      if (LVar4 == LYS_CHOICE) goto LAB_0014ebc7;
      if (plVar6->next == (lys_node *)0x0) {
        do {
          if (plVar6->parent == plVar12) {
            return 0;
          }
          plVar6 = lys_parent(plVar6);
        } while (((plVar6 != (lys_node *)0x0) && (plVar6 != plVar12)) &&
                (plVar6->next == (lys_node *)0x0));
        if (plVar6 == plVar12) {
          return 0;
        }
      }
      pplVar5 = &plVar6->next;
    } while( true );
  }
  if (LVar4 != LYS_GROUPING) {
    return 0;
  }
  if (parent == (lys_node *)0x0) {
    plVar12 = module->data;
    bVar13 = true;
LAB_0014ec11:
    name = node->name;
    plVar7 = lys_find_grouping_up(name,plVar12);
    if (plVar7 != (lys_node_grp *)0x0) {
      pcVar10 = "grouping";
      goto LAB_0014ed44;
    }
  }
  else {
    pplVar5 = lys_child(parent,LYS_GROUPING);
    bVar13 = *pplVar5 != (lys_node *)0x0;
    plVar12 = *pplVar5;
    if (!bVar13) {
      plVar12 = parent;
    }
    if (parent->nodetype != LYS_EXT) goto LAB_0014ec11;
  }
  if (!bVar13) {
    return 0;
  }
  plVar8 = (lys_node *)0x0;
  plVar6 = plVar12;
  while( true ) {
    if ((plVar6 == (lys_node *)0x0) ||
       ((plVar11 = plVar12, plVar8 != (lys_node *)0x0 && (plVar11 = plVar8, plVar6 == plVar8)))) {
      return 0;
    }
    plVar8 = plVar11;
    if ((plVar6->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER))
        != LYS_UNKNOWN) break;
LAB_0014ecce:
    plVar6 = plVar6->prev;
  }
  plVar11 = (lys_node *)0x0;
  do {
    if (plVar11 == (lys_node *)0x0) {
      plVar11 = plVar6;
    }
    LVar4 = plVar11->nodetype;
    node_00 = plVar11;
    do {
      plVar9 = node_00;
      plVar3 = node_00;
      if (((LVar4 & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER)) !=
           LYS_UNKNOWN) && (plVar11 = node_00->child, plVar11 != (lys_node *)0x0))
      goto LAB_0014eca1;
      while( true ) {
        node_00 = plVar9;
        if (node_00 == plVar6) goto LAB_0014ecce;
        plVar11 = plVar3->next;
LAB_0014eca1:
        if (plVar11 != (lys_node *)0x0) break;
        plVar9 = lys_parent(node_00);
        plVar3 = node_00;
      }
      LVar4 = plVar11->nodetype;
      node_00 = plVar11;
    } while (LVar4 != LYS_GROUPING);
    name = node->name;
  } while (name != plVar11->name);
  pcVar10 = "grouping";
LAB_0014ed44:
  ly_vlog(LYE_DUPID,LY_VLOG_LYS,node,pcVar10,name);
  return 1;
}

Assistant:

int
lys_check_id(struct lys_node *node, struct lys_node *parent, struct lys_module *module)
{
    struct lys_node *start, *stop, *iter;
    struct lys_node_grp *grp;
    int down, up;

    assert(node);

    if (!parent) {
        assert(module);
    } else {
        module = parent->module;
    }
    module = lys_main_module(module);

    switch (node->nodetype) {
    case LYS_GROUPING:
        /* 6.2.1, rule 6 */
        if (parent) {
            start = *lys_child(parent, LYS_GROUPING);
            if (!start) {
                down = 0;
                start = parent;
            } else {
                down = 1;
            }
            if (parent->nodetype == LYS_EXT) {
                up = 0;
            } else {
                up = 1;
            }
        } else {
            down = up = 1;
            start = module->data;
        }
        /* go up */
        if (up && lys_find_grouping_up(node->name, start)) {
            LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, "grouping", node->name);
            return EXIT_FAILURE;
        }
        /* go down, because grouping can be defined after e.g. container in which is collision */
        if (down) {
            for (iter = start, stop = NULL; iter; iter = iter->prev) {
                if (!stop) {
                    stop = start;
                } else if (iter == stop) {
                    break;
                }
                if (!(iter->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LIST | LYS_GROUPING | LYS_INPUT | LYS_OUTPUT))) {
                    continue;
                }

                grp = NULL;
                while ((grp = lys_get_next_grouping(grp, iter))) {
                    if (ly_strequal(node->name, grp->name, 1)) {
                        LOGVAL(LYE_DUPID,LY_VLOG_LYS, node, "grouping", node->name);
                        return EXIT_FAILURE;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_LIST:
    case LYS_CONTAINER:
    case LYS_CHOICE:
    case LYS_ANYDATA:
        /* 6.2.1, rule 7 */
        if (parent) {
            iter = parent;
            while (iter && (iter->nodetype & (LYS_USES | LYS_CASE | LYS_CHOICE | LYS_AUGMENT))) {
                if (iter->nodetype == LYS_AUGMENT) {
                    if (((struct lys_node_augment *)iter)->target) {
                        /* augment is resolved, go up */
                        iter = ((struct lys_node_augment *)iter)->target;
                        continue;
                    }
                    /* augment is not resolved, this is the final parent */
                    break;
                }
                iter = iter->parent;
            }

            if (!iter) {
                stop = NULL;
                iter = module->data;
            } else if (iter->nodetype == LYS_EXT) {
                stop = iter;
                iter = *lys_child(iter, node->nodetype);
            } else {
                stop = iter;
                iter = iter->child;
            }
        } else {
            stop = NULL;
            iter = module->data;
        }
        while (iter) {
            if (iter->nodetype & (LYS_USES | LYS_CASE)) {
                iter = iter->child;
                continue;
            }

            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CONTAINER | LYS_CHOICE | LYS_ANYDATA)) {
                if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                    LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, strnodetype(node->nodetype), node->name);
                    return EXIT_FAILURE;
                }
            }

            /* special case for choice - we must check the choice's name as
             * well as the names of nodes under the choice
             */
            if (iter->nodetype == LYS_CHOICE) {
                iter = iter->child;
                continue;
            }

            /* go to siblings */
            if (!iter->next) {
                /* no sibling, go to parent's sibling */
                do {
                    /* for parent LYS_AUGMENT */
                    if (iter->parent == stop) {
                        iter = stop;
                        break;
                    }
                    iter = lys_parent(iter);
                    if (iter && iter->next) {
                        break;
                    }
                } while (iter != stop);

                if (iter == stop) {
                    break;
                }
            }
            iter = iter->next;
        }
        break;
    case LYS_CASE:
        /* 6.2.1, rule 8 */
        if (parent) {
            start = *lys_child(parent, LYS_CASE);
        } else {
            start = module->data;
        }

        LY_TREE_FOR(start, iter) {
            if (!(iter->nodetype & (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST))) {
                continue;
            }

            if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, "case", node->name);
                return EXIT_FAILURE;
            }
        }
        break;
    default:
        /* no check needed */
        break;
    }

    return EXIT_SUCCESS;
}